

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O0

void __thiscall double_conversion::Bignum::MultiplyByUInt64(Bignum *this,uint64_t factor)

{
  uint uVar1;
  uint uVar2;
  Chunk *pCVar3;
  ulong uVar4;
  ulong in_RSI;
  Bignum *in_RDI;
  uint64_t tmp;
  uint64_t product_high;
  uint64_t product_low;
  int i;
  uint64_t high;
  uint64_t low;
  uint64_t carry;
  int local_2c;
  ulong local_18;
  
  if (in_RSI != 1) {
    if (in_RSI == 0) {
      Zero(in_RDI);
    }
    else if (in_RDI->used_bigits_ != 0) {
      local_18 = 0;
      for (local_2c = 0; local_2c < in_RDI->used_bigits_; local_2c = local_2c + 1) {
        pCVar3 = RawBigit(in_RDI,local_2c);
        uVar1 = *pCVar3;
        pCVar3 = RawBigit(in_RDI,local_2c);
        uVar2 = *pCVar3;
        uVar4 = (local_18 & 0xfffffff) + (in_RSI & 0xffffffff) * (ulong)uVar1;
        pCVar3 = RawBigit(in_RDI,local_2c);
        *pCVar3 = (uint)uVar4 & 0xfffffff;
        local_18 = (local_18 >> 0x1c) + (uVar4 >> 0x1c) + (in_RSI >> 0x20) * (ulong)uVar2 * 0x10;
      }
      for (; local_18 != 0; local_18 = local_18 >> 0x1c) {
        EnsureCapacity(0);
        pCVar3 = RawBigit(in_RDI,(int)in_RDI->used_bigits_);
        *pCVar3 = (uint)local_18 & 0xfffffff;
        in_RDI->used_bigits_ = in_RDI->used_bigits_ + 1;
      }
    }
  }
  return;
}

Assistant:

void Bignum::MultiplyByUInt64(const uint64_t factor) {
  if (factor == 1) {
    return;
  }
  if (factor == 0) {
    Zero();
    return;
  }
  if (used_bigits_ == 0) {
    return;
  }
  DOUBLE_CONVERSION_ASSERT(kBigitSize < 32);
  uint64_t carry = 0;
  const uint64_t low = factor & 0xFFFFFFFF;
  const uint64_t high = factor >> 32;
  for (int i = 0; i < used_bigits_; ++i) {
    const uint64_t product_low = low * RawBigit(i);
    const uint64_t product_high = high * RawBigit(i);
    const uint64_t tmp = (carry & kBigitMask) + product_low;
    RawBigit(i) = tmp & kBigitMask;
    carry = (carry >> kBigitSize) + (tmp >> kBigitSize) +
        (product_high << (32 - kBigitSize));
  }
  while (carry != 0) {
    EnsureCapacity(used_bigits_ + 1);
    RawBigit(used_bigits_) = carry & kBigitMask;
    used_bigits_++;
    carry >>= kBigitSize;
  }
}